

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::SingularFieldHelper<2>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  undefined4 uVar1;
  uint8 *ptr;
  uint32 local_1c;
  
  local_1c = md->tag;
  PrimitiveTypeHelper<13>::Serialize(&local_1c,output);
  uVar1 = *field;
  ptr = output->cur_;
  if ((output->impl_).end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr);
  }
  output->cur_ = ptr;
  *(undefined4 *)ptr = uVar1;
  output->cur_ = ptr + 4;
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeTo<type>(field, output);
  }